

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O2

void cgltf_node_transform_local(cgltf_node *node,cgltf_float *out_matrix)

{
  float fVar1;
  float fVar2;
  float fVar3;
  cgltf_float cVar4;
  float fVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  
  if (node->has_matrix != 0) {
    uVar6 = *(undefined8 *)node->matrix;
    uVar7 = *(undefined8 *)(node->matrix + 2);
    uVar8 = *(undefined8 *)(node->matrix + 4);
    uVar9 = *(undefined8 *)(node->matrix + 6);
    uVar10 = *(undefined8 *)(node->matrix + 8);
    uVar11 = *(undefined8 *)(node->matrix + 10);
    uVar12 = *(undefined8 *)(node->matrix + 0xe);
    *(undefined8 *)(out_matrix + 0xc) = *(undefined8 *)(node->matrix + 0xc);
    *(undefined8 *)(out_matrix + 0xe) = uVar12;
    *(undefined8 *)(out_matrix + 8) = uVar10;
    *(undefined8 *)(out_matrix + 10) = uVar11;
    *(undefined8 *)(out_matrix + 4) = uVar8;
    *(undefined8 *)(out_matrix + 6) = uVar9;
    *(undefined8 *)out_matrix = uVar6;
    *(undefined8 *)(out_matrix + 2) = uVar7;
    return;
  }
  fVar1 = node->rotation[3];
  fVar2 = node->scale[0];
  fVar18 = (float)*(undefined8 *)(node->rotation + 1);
  fVar20 = (float)((ulong)*(undefined8 *)(node->rotation + 1) >> 0x20);
  fVar17 = (fVar20 + fVar20) * fVar1;
  fVar13 = (float)*(undefined8 *)node->rotation;
  fVar14 = (float)((ulong)*(undefined8 *)node->rotation >> 0x20);
  fVar13 = fVar13 + fVar13;
  fVar14 = fVar14 + fVar14;
  fVar16 = -fVar14 * fVar18;
  fVar18 = fVar13 * fVar18;
  fVar19 = -(fVar20 + fVar20) * fVar20;
  fVar15 = 1.0 - node->rotation[0] * fVar13;
  fVar3 = node->scale[1];
  cVar4 = node->translation[2];
  fVar5 = node->scale[2];
  uVar6 = *(undefined8 *)node->translation;
  out_matrix[3] = 0.0;
  out_matrix[7] = 0.0;
  *(ulong *)out_matrix = CONCAT44((fVar18 + fVar17) * fVar2,(fVar19 + fVar16 + 1.0) * fVar2);
  out_matrix[2] = (fVar13 * fVar20 - fVar14 * fVar1) * fVar2;
  *(ulong *)(out_matrix + 4) = CONCAT44((fVar15 + fVar19) * fVar3,(-fVar17 + fVar18) * fVar3);
  out_matrix[6] = (fVar14 * fVar20 + fVar1 * fVar13) * fVar3;
  *(ulong *)(out_matrix + 8) =
       CONCAT44(fVar5 * (fVar14 * fVar20 + -(fVar1 * fVar13)),
                fVar5 * (fVar13 * fVar20 + fVar14 * fVar1));
  out_matrix[10] = (fVar15 + fVar16) * fVar5;
  out_matrix[0xb] = 0.0;
  *(undefined8 *)(out_matrix + 0xc) = uVar6;
  out_matrix[0xe] = cVar4;
  out_matrix[0xf] = 1.0;
  return;
}

Assistant:

void cgltf_node_transform_local(const cgltf_node* node, cgltf_float* out_matrix)
{
    cgltf_float* lm = out_matrix;

    if (node->has_matrix)
    {
        memcpy(lm, node->matrix, sizeof(float) * 16);
    }
    else
    {
        float tx = node->translation[0];
        float ty = node->translation[1];
        float tz = node->translation[2];

        float qx = node->rotation[0];
        float qy = node->rotation[1];
        float qz = node->rotation[2];
        float qw = node->rotation[3];

        float sx = node->scale[0];
        float sy = node->scale[1];
        float sz = node->scale[2];

        lm[0] = (1 - 2 * qy*qy - 2 * qz*qz) * sx;
        lm[1] = (2 * qx*qy + 2 * qz*qw) * sx;
        lm[2] = (2 * qx*qz - 2 * qy*qw) * sx;
        lm[3] = 0.f;

        lm[4] = (2 * qx*qy - 2 * qz*qw) * sy;
        lm[5] = (1 - 2 * qx*qx - 2 * qz*qz) * sy;
        lm[6] = (2 * qy*qz + 2 * qx*qw) * sy;
        lm[7] = 0.f;

        lm[8] = (2 * qx*qz + 2 * qy*qw) * sz;
        lm[9] = (2 * qy*qz - 2 * qx*qw) * sz;
        lm[10] = (1 - 2 * qx*qx - 2 * qy*qy) * sz;
        lm[11] = 0.f;

        lm[12] = tx;
        lm[13] = ty;
        lm[14] = tz;
        lm[15] = 1.f;
    }
}